

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QTzTransition>::data(QList<QTzTransition> *this)

{
  QArrayDataPointer<QTzTransition> *this_00;
  QTzTransition *pQVar1;
  QArrayDataPointer<QTzTransition> *in_RDI;
  
  detach((QList<QTzTransition> *)0x75699c);
  this_00 = (QArrayDataPointer<QTzTransition> *)QArrayDataPointer<QTzTransition>::operator->(in_RDI)
  ;
  pQVar1 = QArrayDataPointer<QTzTransition>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }